

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
mjs::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,property_assignment_type t)

{
  wostream *pwVar1;
  
  if (t < (set|get)) {
    pwVar1 = std::operator<<(os,&DAT_001a4ef8 + *(int *)(&DAT_001a4ef8 + (ulong)t * 4));
    return pwVar1;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0xf0,
                "std::basic_ostream<CharT> &mjs::operator<<(std::basic_ostream<CharT> &, property_assignment_type) [CharT = wchar_t]"
               );
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, property_assignment_type t) {
    switch (t) {
    case property_assignment_type::normal:  return os << "normal";
    case property_assignment_type::get:     return os << "get";
    case property_assignment_type::set:     return os << "set";
    }
    assert(false);
    return os << "property_assignment_type{" << static_cast<int>(t) << "}";
}